

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uv-common.c
# Opt level: O3

int uv_loop_close(uv_loop_t *loop)

{
  void *pvVar1;
  uv__queue *puVar2;
  
  if ((loop->active_reqs).count != 0) {
    return -0x10;
  }
  puVar2 = &loop->handle_queue;
  do {
    puVar2 = puVar2->next;
    if (puVar2 == &loop->handle_queue) {
      uv__loop_close(loop);
      pvVar1 = loop->data;
      memset(&loop->active_handles,0xff,800);
      loop->data = pvVar1;
      if (default_loop_ptr != loop) {
        return 0;
      }
      default_loop_ptr = (uv_loop_t *)0x0;
      return 0;
    }
  } while (((ulong)puVar2[1].prev & 0x10) != 0);
  return -0x10;
}

Assistant:

int uv_loop_close(uv_loop_t* loop) {
  struct uv__queue* q;
  uv_handle_t* h;
#ifndef NDEBUG
  void* saved_data;
#endif

  if (uv__has_active_reqs(loop))
    return UV_EBUSY;

  uv__queue_foreach(q, &loop->handle_queue) {
    h = uv__queue_data(q, uv_handle_t, handle_queue);
    if (!(h->flags & UV_HANDLE_INTERNAL))
      return UV_EBUSY;
  }

  uv__loop_close(loop);

#ifndef NDEBUG
  saved_data = loop->data;
  memset(loop, -1, sizeof(*loop));
  loop->data = saved_data;
#endif
  if (loop == default_loop_ptr)
    default_loop_ptr = NULL;

  return 0;
}